

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O2

void __thiscall
crnlib::clusterizer<crnlib::vec<16U,_float>_>::split_node
          (clusterizer<crnlib::vec<16U,_float>_> *this,uint index)

{
  vector<unsigned_int> *this_00;
  vector<unsigned_int> *this_01;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *rhs;
  uint uVar1;
  uint uVar2;
  pair<crnlib::vec<16U,_float>,_unsigned_int> *ppVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  uint *obj;
  uint node_index;
  uint i;
  ulong uVar8;
  vq_node *pvVar9;
  vq_node *this_02;
  float fVar10;
  float fVar11;
  float fVar12;
  float val;
  float fVar13;
  float fVar14;
  ulong local_1c0;
  ulong local_1b8;
  vec<16U,_float> new_right_child;
  vec<16U,_float> new_left_child;
  vec<16U,_float> right_child;
  vec<16U,_float> left_child;
  vec<16U,_float> local_70;
  
  pvVar9 = (this->m_nodes).m_p;
  if (pvVar9[index].m_vectors.m_size != 1) {
    pvVar9 = pvVar9 + index;
    if (this->m_quick == true) {
      compute_split_estimate(this,&left_child,&right_child,pvVar9);
    }
    else {
      compute_split_pca(this,&left_child,&right_child,pvVar9);
    }
    iVar4 = 8;
    if (this->m_quick != false) {
      iVar4 = 2;
    }
    this_00 = &this->m_left_children;
    this_01 = &this->m_right_children;
    fVar13 = 0.0;
    fVar14 = 0.0;
    local_1b8 = 0;
    local_1c0 = 0;
    fVar10 = 1e+10;
    for (iVar5 = 0; iVar5 != iVar4; iVar5 = iVar5 + 1) {
      vector<unsigned_int>::resize(this_00,0,false);
      vector<unsigned_int>::resize(this_01,0,false);
      new_left_child.m_s[0xc] = 0.0;
      new_left_child.m_s[0xd] = 0.0;
      new_left_child.m_s[0xe] = 0.0;
      new_left_child.m_s[0xf] = 0.0;
      new_left_child.m_s[8] = 0.0;
      new_left_child.m_s[9] = 0.0;
      new_left_child.m_s[10] = 0.0;
      new_left_child.m_s[0xb] = 0.0;
      new_left_child.m_s[4] = 0.0;
      new_left_child.m_s[5] = 0.0;
      new_left_child.m_s[6] = 0.0;
      new_left_child.m_s[7] = 0.0;
      new_left_child.m_s[0] = 0.0;
      new_left_child.m_s[1] = 0.0;
      new_left_child.m_s[2] = 0.0;
      new_left_child.m_s[3] = 0.0;
      new_right_child.m_s[0xc] = 0.0;
      new_right_child.m_s[0xd] = 0.0;
      new_right_child.m_s[0xe] = 0.0;
      new_right_child.m_s[0xf] = 0.0;
      new_right_child.m_s[8] = 0.0;
      new_right_child.m_s[9] = 0.0;
      new_right_child.m_s[10] = 0.0;
      new_right_child.m_s[0xb] = 0.0;
      new_right_child.m_s[4] = 0.0;
      new_right_child.m_s[5] = 0.0;
      new_right_child.m_s[6] = 0.0;
      new_right_child.m_s[7] = 0.0;
      new_right_child.m_s[0] = 0.0;
      new_right_child.m_s[1] = 0.0;
      new_right_child.m_s[2] = 0.0;
      new_right_child.m_s[3] = 0.0;
      fVar13 = 0.0;
      lVar6 = 0;
      fVar14 = 0.0;
      local_1b8 = 0;
      local_1c0 = 0;
      for (uVar8 = 0; uVar8 < (pvVar9->m_vectors).m_size; uVar8 = uVar8 + 1) {
        uVar1 = *(uint *)((long)(pvVar9->m_vectors).m_p + lVar6);
        ppVar3 = (this->m_training_vecs).m_p;
        rhs = ppVar3 + uVar1;
        uVar7 = (ulong)ppVar3[uVar1].second;
        fVar11 = vec<16U,_float>::squared_distance(&left_child,&rhs->first);
        fVar12 = vec<16U,_float>::squared_distance(&right_child,&rhs->first);
        obj = (uint *)((long)(pvVar9->m_vectors).m_p + lVar6);
        val = (float)uVar7;
        if (fVar12 <= fVar11) {
          vector<unsigned_int>::push_back(this_01,obj);
          operator*(&rhs->first,val);
          vec<16U,_float>::operator+=(&new_right_child,&local_70);
          local_1b8 = local_1b8 + uVar7;
          fVar11 = operator*(&rhs->first,&rhs->first);
          fVar13 = fVar13 + fVar11 * val;
        }
        else {
          vector<unsigned_int>::push_back(this_00,obj);
          operator*(&rhs->first,val);
          vec<16U,_float>::operator+=(&new_left_child,&local_70);
          local_1c0 = local_1c0 + uVar7;
          fVar11 = operator*(&rhs->first,&rhs->first);
          fVar14 = fVar14 + fVar11 * val;
        }
        lVar6 = lVar6 + 4;
      }
      if ((local_1c0 == 0) || (local_1b8 == 0)) {
        pvVar9->m_unsplittable = true;
        return;
      }
      fVar11 = operator*(&new_left_child,&new_left_child);
      fVar12 = operator*(&new_right_child,&new_right_child);
      fVar14 = fVar14 - fVar11 / (float)local_1c0;
      fVar13 = fVar13 - fVar12 / (float)local_1b8;
      vec<16U,_float>::operator*=(&new_left_child,1.0 / (float)local_1c0);
      vec<16U,_float>::operator*=(&new_right_child,1.0 / (float)local_1b8);
      vec<16U,_float>::operator=(&left_child,&new_left_child);
      vec<16U,_float>::operator=(&right_child,&new_right_child);
      fVar11 = fVar14 + fVar13;
      if ((fVar11 < 1e-05) || ((fVar10 - fVar11) / fVar11 < 0.00125)) break;
      fVar10 = fVar11;
    }
    uVar1 = (this->m_nodes).m_size;
    node_index = uVar1 + 1;
    pvVar9->m_left = uVar1;
    pvVar9->m_right = node_index;
    uVar2 = this->m_split_index;
    pvVar9->m_codebook_index = uVar2;
    this->m_split_index = uVar2 + 1;
    vector<crnlib::clusterizer<crnlib::vec<16U,_float>_>::vq_node>::resize
              (&this->m_nodes,uVar1 + 2,false);
    pvVar9 = (this->m_nodes).m_p;
    this_02 = pvVar9 + node_index;
    vec<16U,_float>::operator=(&pvVar9[uVar1].m_centroid,&left_child);
    pvVar9[uVar1].m_total_weight = local_1c0;
    vector<unsigned_int>::swap(&pvVar9[uVar1].m_vectors,this_00);
    pvVar9[uVar1].m_variance = fVar14;
    if ((1 < pvVar9[uVar1].m_vectors.m_size) && (0.0 < fVar14)) {
      insert_heap(this,uVar1);
    }
    vec<16U,_float>::operator=(&this_02->m_centroid,&right_child);
    this_02->m_total_weight = local_1b8;
    vector<unsigned_int>::swap(&this_02->m_vectors,this_01);
    this_02->m_variance = fVar13;
    if ((1 < (this_02->m_vectors).m_size) && (0.0 < fVar13)) {
      insert_heap(this,node_index);
    }
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }